

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkSubpassDependency2 * __thiscall
Fossilize::StateRecorder::Impl::copy<VkSubpassDependency2>
          (Impl *this,VkSubpassDependency2 *src,size_t count,ScratchAllocator *alloc)

{
  VkSubpassDependency2 *new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkSubpassDependency2 *src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkSubpassDependency2>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkSubpassDependency2_const*,VkSubpassDependency2*>
                (src,src + count,(VkSubpassDependency2 *)this_local);
    }
  }
  return (VkSubpassDependency2 *)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}